

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  char *__nbytes;
  AutoCloseFd local_a8;
  int fds [2];
  char buf [7];
  AutoCloseFd local_90;
  FdOutputStream out;
  FdInputStream in;
  Fault f;
  
  do {
    iVar1 = pipe(fds);
    if (-1 < iVar1) goto LAB_0016e375;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
               ,0x27,iVar1,"miniposix::pipe(fds)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_0016e375:
  local_a8.fd = fds[0];
  UnwindDetector::UnwindDetector(&local_a8.unwindDetector);
  FdInputStream::FdInputStream(&in,&local_a8);
  AutoCloseFd::~AutoCloseFd(&local_a8);
  local_90.fd = fds[1];
  UnwindDetector::UnwindDetector(&local_90.unwindDetector);
  FdOutputStream::FdOutputStream(&out,&local_90);
  AutoCloseFd::~AutoCloseFd(&local_90);
  f.exception = (Exception *)0x0;
  __nbytes = "bar";
  FdOutputStream::write(&out,(int)&f,(void *)0x5,0x18dc81);
  InputStream::read(&in.super_InputStream,(int)buf,(void *)0x6,(size_t)__nbytes);
  buf[6] = '\0';
  iVar1 = bcmp("foobar",&buf,7);
  if ((iVar1 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
               ,0x3a,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",&buf);
  }
  FdOutputStream::~FdOutputStream(&out);
  FdInputStream::~FdInputStream(&in);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2];
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((AutoCloseFd(fds[0])));
  FdOutputStream out((AutoCloseFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}